

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

void __thiscall
ON_BinaryArchive::SetArchiveFullPath(ON_BinaryArchive *this,wchar_t *archive_full_path)

{
  ON_wString *this_00;
  bool bVar1;
  wchar_t *path;
  wchar_t *pwVar2;
  wchar_t *archive_file_name_00;
  wchar_t *f;
  wchar_t *dr;
  ON_wString archive_directory_name;
  ON_wString current_directory;
  ON_wString archive_file_name;
  ON_wString local_full_path;
  wchar_t *d;
  wchar_t *e;
  wchar_t *local_68;
  wchar_t *local_60;
  ON_wString local_58;
  ON_wString local_50;
  ON_wString local_48;
  ON_wString local_40;
  ON_wString local_38;
  wchar_t *local_30;
  wchar_t *local_28;
  
  this_00 = &this->m_archive_full_path;
  bVar1 = ON_wString::IsNotEmpty(this_00);
  if (!bVar1) {
    ON_wString::ON_wString(&local_40,archive_full_path);
    path = ON_wString::operator_cast_to_wchar_t_(&local_40);
    ON_wString::ON_wString(&local_48);
    ON_wString::ON_wString(&local_58);
    if (path == (wchar_t *)0x0) {
      path = (wchar_t *)0x0;
    }
    else if (*path != L'\0') {
      local_60 = (wchar_t *)0x0;
      local_30 = (wchar_t *)0x0;
      local_68 = (wchar_t *)0x0;
      local_28 = (wchar_t *)0x0;
      on_wsplitpath(path,&local_60,&local_30,&local_68,&local_28);
      if ((path == local_68) ||
         (((path < local_68 && (local_30 != (wchar_t *)0x0)) &&
          (bVar1 = ON_FileSystemPath::IsRelativePath(path), bVar1)))) {
        ON_FileSystemPath::CurrentDirectory(SUB81(&local_50,0));
        bVar1 = ON_wString::IsNotEmpty(&local_50);
        if (bVar1) {
          pwVar2 = ON_wString::operator_cast_to_wchar_t_(&local_50);
          ON_FileSystemPath::CombinePaths
                    ((ON_FileSystemPath *)&local_38,pwVar2,false,path,true,false);
          ON_wString::operator=(&local_40,&local_38);
          ON_wString::~ON_wString(&local_38);
          path = ON_wString::operator_cast_to_wchar_t_(&local_40);
          on_wsplitpath(path,&local_60,&local_30,&local_68,&local_28);
        }
        ON_wString::~ON_wString(&local_50);
      }
      if ((local_68 != (wchar_t *)0x0) && (*local_68 != L'\0')) {
        ON_wString::operator=(&local_48,local_68);
        if (local_60 == (wchar_t *)0x0) {
          local_60 = local_30;
        }
        if (((local_60 != (wchar_t *)0x0) && (*local_60 != L'\0')) && (local_60 < local_68)) {
          ON_wString::operator=(&local_58,local_60);
          ON_wString::SetLength(&local_58,(long)local_68 - (long)local_60 >> 2);
        }
      }
    }
    pwVar2 = ON_wString::operator_cast_to_wchar_t_(&local_58);
    archive_file_name_00 = ON_wString::operator_cast_to_wchar_t_(&local_48);
    SetArchiveFullPath(this,pwVar2,archive_file_name_00);
    ON_wString::operator=(this_00,path);
    if ((this->m_mode | 4) == write3dm) {
      ON_wString::operator=(&this->m_archive_saved_as_full_path,this_00);
    }
    ON_wString::~ON_wString(&local_58);
    ON_wString::~ON_wString(&local_48);
    ON_wString::~ON_wString(&local_40);
    return;
  }
  bVar1 = ON_wString::EqualOrdinal(this_00,archive_full_path,false);
  if (bVar1) {
    return;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,0x194,"","Attempt to change archive path.");
  return;
}

Assistant:

void ON_BinaryArchive::SetArchiveFullPath(
  const wchar_t* archive_full_path
  )
{
  if (m_archive_full_path.IsNotEmpty())
  {
    // The first attempt wins!
    if (false == m_archive_full_path.EqualOrdinal(archive_full_path, false))
    {
      // You need to get this right on the first try.
      // If you are hitting this error, figure out why you are attempting to change
      // this value and/or and make sure ArchiveFullPath().IsEmpty() 
      // is true before you attempt to set it.
      // This is here because the value gets set correctly and then changed
      // to the wrong value when people use temp files and rename after writing
      // and don't pay attention to what they are doing.
      ON_ERROR("Attempt to change archive path.");
    }
    return;
  }

  ON_wString local_full_path(archive_full_path);
  archive_full_path = local_full_path;

  ON_wString archive_file_name;
  ON_wString archive_directory_name;

  if (nullptr != archive_full_path && 0 != archive_full_path[0])
  {
    const wchar_t* dr = 0;
    const wchar_t* d = 0;
    const wchar_t* f = 0;
    const wchar_t* e = 0;
    on_wsplitpath(archive_full_path, &dr, &d, &f, &e);

    if (archive_full_path == f || (nullptr !=  d && f > archive_full_path && ON_FileSystemPath::IsRelativePath(archive_full_path) ) )
    {
      const ON_wString current_directory = ON_FileSystemPath::CurrentDirectory(true);
      if (current_directory.IsNotEmpty())
      {
        local_full_path = ON_FileSystemPath::CombinePaths(static_cast<const wchar_t*>(current_directory), false, archive_full_path, true, false);
        archive_full_path = local_full_path;
        on_wsplitpath(archive_full_path, &dr, &d, &f, &e);
      }
    }

    if (nullptr != f && 0 != f[0])
    {

      archive_file_name = f;
      if (nullptr == dr)
        dr = d;
      if (nullptr != dr && 0 != dr[0] && dr < f)
      {
        archive_directory_name = dr;
        archive_directory_name.SetLength(f-dr);
      }
    }
  }

  SetArchiveFullPath(
    static_cast<const wchar_t*>(archive_directory_name),
    static_cast<const wchar_t*>(archive_file_name)
    );
  m_archive_full_path = archive_full_path;
  switch (m_mode)
  {
  case ON::archive_mode::write3dm:
  case ON::archive_mode::write:
    m_archive_saved_as_full_path = m_archive_full_path;
    break;
  default:
    break;
  }
}